

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

wchar_t quests_count(void)

{
  wchar_t num;
  quest **ppqVar1;
  
  num = L'\0';
  ppqVar1 = &quests;
  while( true ) {
    ppqVar1 = &((quest *)ppqVar1)->next->next;
    if ((quest *)ppqVar1 == (quest *)0x0) break;
    num = num + (uint)((quest *)ppqVar1)->complete;
  }
  return num;
}

Assistant:

int quests_count(void)
{
	struct quest *quest = quests;
	int num = 0;
	while (quest) {
		if (quest->complete) {
			num++;
		}
		quest = quest->next;
	}
	return num;
}